

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int nghttp2_hd_deflate_init(nghttp2_hd_deflater *deflater,nghttp2_mem *mem)

{
  int iVar1;
  
  iVar1 = nghttp2_hd_deflate_init2(deflater,0x1000,mem);
  return iVar1;
}

Assistant:

int nghttp2_hd_deflate_init(nghttp2_hd_deflater *deflater, nghttp2_mem *mem) {
  return nghttp2_hd_deflate_init2(
      deflater, NGHTTP2_HD_DEFAULT_MAX_DEFLATE_BUFFER_SIZE, mem);
}